

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O3

int __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,int __fd,sockaddr *__addr,
          socklen_t __len)

{
  int iVar1;
  undefined4 in_register_00000034;
  error_code __ec;
  error_code ec;
  uint local_48 [2];
  error_category *local_40;
  system_error local_38 [32];
  
  local_48[0] = 0;
  local_40 = (error_category *)std::_V2::system_category();
  iVar1 = detail::reactive_socket_service<asio::ip::udp>::bind
                    ((this->impl_).service_,(int)this + 8,
                     (sockaddr *)CONCAT44(in_register_00000034,__fd),(socklen_t)local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48[0];
  if (local_48[0] != 0) {
    __ec._M_cat = local_40;
    std::system_error::system_error(local_38,__ec,"bind");
    detail::throw_exception<std::system_error>(local_38);
    iVar1 = std::system_error::~system_error(local_38);
  }
  return iVar1;
}

Assistant:

void bind(const endpoint_type& endpoint)
  {
    asio::error_code ec;
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }